

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

xmlChar * xmlBufDetach(xmlBufPtr buf)

{
  xmlChar *pxVar1;
  
  if ((buf == (xmlBufPtr)0x0) || ((buf->flags & 7) != 0)) {
    pxVar1 = (xmlChar *)0x0;
  }
  else {
    pxVar1 = buf->mem;
    if (buf->content != pxVar1) {
      pxVar1 = xmlStrndup(buf->content,(int)buf->use);
      (*xmlFree)(buf->mem);
    }
    buf->mem = (xmlChar *)0x0;
    buf->use = 0;
    buf->content = (xmlChar *)0x0;
    buf->compat_use = 0;
    buf->compat_size = 0;
    buf->size = 0;
  }
  return pxVar1;
}

Assistant:

xmlChar *
xmlBufDetach(xmlBufPtr buf) {
    xmlChar *ret;

    if ((buf == NULL) || (BUF_ERROR(buf)) || (BUF_STATIC(buf)))
        return(NULL);

    if (buf->content != buf->mem) {
        ret = xmlStrndup(buf->content, buf->use);
        xmlFree(buf->mem);
    } else {
        ret = buf->mem;
    }

    buf->content = NULL;
    buf->mem = NULL;
    buf->size = 0;
    buf->use = 0;

    UPDATE_COMPAT(buf);
    return ret;
}